

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::read_regular_image
          (mipmapped_texture *this,data_stream_serializer *serializer)

{
  color_quad<unsigned_char,_int> *p;
  bool bVar1;
  image_u8 *dest;
  mip_level *this_00;
  undefined1 *other;
  
  dest = (image_u8 *)crnlib_malloc(0x30);
  dest->m_width = 0;
  dest->m_height = 0;
  dest->m_pitch = 0;
  dest->m_total = 0;
  dest->m_comp_flags = 0xf;
  dest->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  (dest->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
  (dest->m_pixel_buf).m_size = 0;
  (dest->m_pixel_buf).m_capacity = 0;
  bVar1 = image_utils::read_from_stream(dest,serializer,0);
  if (bVar1) {
    this_00 = (mip_level *)crnlib_malloc(0x28);
    this_00->m_width = 0;
    this_00->m_height = 0;
    this_00->m_comp_flags = cDefaultCompFlags;
    *(undefined8 *)&this_00->m_format = 0;
    *(undefined8 *)((long)&this_00->m_pImage + 4) = 0;
    *(undefined8 *)((long)&this_00->m_pDXTImage + 4) = 0;
    mip_level::assign(this_00,dest,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
    assign(this,this_00);
    if (serializer->m_pStream == (data_stream *)0x0) {
      other = g_empty_dynamic_string;
    }
    else {
      other = (undefined1 *)&serializer->m_pStream->m_name;
    }
    dynamic_string::set(&this->m_name,(dynamic_string *)other,0xffffffff);
  }
  else {
    p = (dest->m_pixel_buf).m_p;
    if (p != (color_quad<unsigned_char,_int> *)0x0) {
      crnlib_free(p);
    }
    crnlib_free(dest);
    dynamic_string::set(&this->m_last_error,"Failed loading image file",0xffffffff);
  }
  return bVar1;
}

Assistant:

bool mipmapped_texture::read_regular_image(data_stream_serializer& serializer) {
  image_u8* pImg = crnlib_new<image_u8>();
  bool status = image_utils::read_from_stream(*pImg, serializer, 0);
  if (!status) {
    crnlib_delete(pImg);

    set_last_error("Failed loading image file");
    return false;
  }

  mip_level* pLevel = crnlib_new<mip_level>();
  pLevel->assign(pImg);

  assign(pLevel);
  set_name(serializer.get_name());

  return true;
}